

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O1

DSFrame * __thiscall
AVSInterface::AVSFetchFrameFunctor::operator()
          (DSFrame *__return_storage_ptr__,AVSFetchFrameFunctor *this,int n)

{
  mutex *__mutex;
  IClip *pIVar1;
  int iVar2;
  undefined8 uVar3;
  PVideoFrame frame;
  PVideoFrame local_28;
  
  __mutex = &this->fetch_frame_mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    pIVar1 = (this->_clip).p;
    (*pIVar1->_vptr_IClip[1])(&local_28,pIVar1,(ulong)(uint)n,this->_env);
    DSFrame::DSFrame(__return_storage_ptr__,&local_28,this->_vi,this->_env);
    PVideoFrame::~PVideoFrame(&local_28);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar3 = std::__throw_system_error(iVar2);
  PVideoFrame::~PVideoFrame(&local_28);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

DSFrame operator()(int n) override {
      std::lock_guard<std::mutex> guard(fetch_frame_mutex);
      auto frame = _clip->GetFrame(n, _env);
      return DSFrame(frame, _vi, _env);
    }